

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>,_const_QString_&>,_char16_t>
::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>,_const_QString_&>,_char16_t>
          *this)

{
  QLatin1String *pQVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  QChar *pQVar6;
  QString *pQVar7;
  char16_t *pcVar8;
  
  lVar2 = (this->a).a.a.a.m_size;
  lVar3 = (((this->a).a.a.b)->d).size;
  lVar4 = (((this->a).b)->d).size;
  lVar5 = (this->a).a.b.m_size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar4 + lVar2 + lVar3 + lVar5 + 1,Uninitialized);
  pQVar6 = (QChar *)(__return_storage_ptr__->d).ptr;
  lVar2 = (this->a).a.a.a.m_size;
  QAbstractConcatenable::appendLatin1To((this->a).a.a.a,pQVar6);
  pQVar6 = pQVar6 + lVar2;
  pQVar7 = (this->a).a.a.b;
  lVar2 = (pQVar7->d).size;
  if (lVar2 != 0) {
    pcVar8 = (pQVar7->d).ptr;
    if (pcVar8 == (char16_t *)0x0) {
      pcVar8 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar6,pcVar8,lVar2 * 2);
  }
  pQVar6 = pQVar6 + lVar2;
  pQVar1 = &(this->a).a.b;
  lVar2 = pQVar1->m_size;
  QAbstractConcatenable::appendLatin1To(*pQVar1,pQVar6);
  pQVar7 = (this->a).b;
  lVar3 = (pQVar7->d).size;
  if (lVar3 != 0) {
    pcVar8 = (pQVar7->d).ptr;
    if (pcVar8 == (char16_t *)0x0) {
      pcVar8 = (char16_t *)&QString::_empty;
    }
    memcpy(pQVar6 + lVar2,pcVar8,lVar3 * 2);
  }
  (pQVar6 + lVar2)[lVar3].ucs = this->b;
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }